

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  cmDeleteAll<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FunctionScopes);
  cmDeleteAll<std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>>
            (&this->FileScopes);
  ScopePool::~ScopePool(&this->ProcessScope);
  std::_Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  ~_Vector_base(&(this->FileScopes).
                 super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
               );
  std::_Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  ~_Vector_base((_Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                 *)this);
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}